

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Emulator.cpp
# Opt level: O0

void mainLoop(void)

{
  Console *c;
  
  Console::Instance();
  while ((isRunning & 1U) != 0) {
    Console::frame(c);
  }
  return;
}

Assistant:

void mainLoop() {
    Console &c = Console::Instance();

#ifdef __EMSCRIPTEN__
    c.getCPU()->execute();
    c.getCPU()->execute();
#endif

    while (isRunning) {
	    c.frame();
    }
}